

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  char *pcVar2;
  float *pfVar3;
  undefined8 *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float fVar4;
  double dVar5;
  float max;
  float min;
  float slope;
  int i_1;
  float *m_1;
  float *w_2;
  int q_1;
  float sum_1;
  int p_2;
  float top_rescale;
  float *out_f32;
  int *out_s32;
  int p_1;
  int i;
  char *m;
  char *w_1;
  int q;
  int *out;
  int sum;
  int p;
  Option opt_g;
  Mat bottom_blob_int8;
  Mat bottom_blob_tm;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  float local_284;
  Mat *in_stack_fffffffffffffd80;
  Mat *this_00;
  Mat *in_stack_fffffffffffffd88;
  size_t in_stack_fffffffffffffd90;
  int _c;
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  Mat *in_stack_fffffffffffffda0;
  float local_1f8;
  int local_1f4;
  Mat local_1f0;
  Mat *local_1b0;
  float *local_1a8;
  int local_19c;
  float local_198;
  int local_194;
  float local_190;
  float local_18c;
  float *local_188;
  int *local_180;
  int local_178;
  int local_174;
  Mat local_170;
  char *local_130;
  char *local_128;
  int local_11c;
  int *local_118;
  int local_110;
  int local_10c;
  undefined8 local_108;
  Allocator *pAStack_100;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined8 local_e8;
  uint local_d8;
  Mat local_c8;
  Mat local_88;
  int local_44;
  size_t local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  Mat *local_20;
  Mat *local_18;
  int local_4;
  
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_34 = in_RSI->c;
  local_40 = in_RSI->elemsize;
  local_44 = local_2c * local_30;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  Mat::create(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd90,
              (Allocator *)in_stack_fffffffffffffd88);
  _c = (int)(in_stack_fffffffffffffd90 >> 0x20);
  bVar1 = Mat::empty(in_stack_fffffffffffffd80);
  if (bVar1) {
    return -100;
  }
  if ((*(byte *)(in_RDI + 0x19c) & 1) == 0) {
    for (local_194 = 0; local_194 < *(int *)(in_RDI + 0x80); local_194 = local_194 + 1) {
      local_198 = 0.0;
      if (*(int *)(in_RDI + 0x84) != 0) {
        pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x118),local_194);
        local_198 = *pfVar3;
      }
      for (local_19c = 0; local_19c < local_34; local_19c = local_19c + 1) {
        local_1a8 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0xd8));
        local_1a8 = local_1a8 +
                    (long)(local_44 * local_34 * local_194) + (long)(local_44 * local_19c);
        this_00 = &local_1f0;
        Mat::channel(in_stack_fffffffffffffd88,(int)((ulong)this_00 >> 0x20));
        in_stack_fffffffffffffd88 = (Mat *)Mat::operator_cast_to_float_(this_00);
        Mat::~Mat((Mat *)0x16486c);
        for (local_1f4 = 0; local_1f4 < local_44; local_1f4 = local_1f4 + 1) {
          local_198 = *(float *)((long)&in_stack_fffffffffffffd88->data + (long)local_1f4 * 4) *
                      local_1a8[local_1f4] + local_198;
        }
        local_1b0 = in_stack_fffffffffffffd88;
      }
      if (*(int *)(in_RDI + 0x90) == 1) {
        local_1f8 = 0.0;
        pfVar3 = std::max<float>(&local_198,&local_1f8);
        local_198 = *pfVar3;
      }
      else if (*(int *)(in_RDI + 0x90) == 2) {
        pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x98),0);
        if (local_198 <= 0.0) {
          local_284 = local_198 * *pfVar3;
        }
        else {
          local_284 = local_198;
        }
        local_198 = local_284;
      }
      else if (*(int *)(in_RDI + 0x90) == 3) {
        pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x98),0);
        fVar4 = *pfVar3;
        pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x98),1);
        if (local_198 < fVar4) {
          local_198 = fVar4;
        }
        if (*pfVar3 < local_198) {
          local_198 = *pfVar3;
        }
      }
      else if (*(int *)(in_RDI + 0x90) == 4) {
        dVar5 = std::exp((double)(ulong)(uint)-local_198);
        local_198 = 1.0 / (SUB84(dVar5,0) + 1.0);
      }
      fVar4 = local_198;
      pfVar3 = Mat::operator[](local_20,local_194);
      *pfVar3 = fVar4;
    }
    return 0;
  }
  Mat::Mat(&local_88,local_18);
  if (local_40 != 1) {
    Mat::Mat(&local_c8);
    Mat::create(in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,_c,
                (size_t)in_stack_fffffffffffffd88,(Allocator *)in_stack_fffffffffffffd80);
    bVar1 = Mat::empty(in_stack_fffffffffffffd80);
    if (bVar1) {
      local_4 = -100;
    }
    else {
      local_e8 = local_28[4];
      local_108 = *local_28;
      local_f8 = *(undefined4 *)(local_28 + 2);
      uStack_f4 = *(undefined4 *)((long)local_28 + 0x14);
      uStack_f0 = *(undefined4 *)(local_28 + 3);
      uStack_ec = *(undefined4 *)((long)local_28 + 0x1c);
      pAStack_100 = local_c8.allocator;
      (**(code **)(**(long **)(in_RDI + 0x1a0) + 0x38))
                (*(long **)(in_RDI + 0x1a0),local_18,&local_c8,&local_108);
      Mat::operator=(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    }
    local_d8 = (uint)bVar1;
    Mat::~Mat((Mat *)0x164309);
    if (local_d8 != 0) goto LAB_0016473a;
  }
  for (local_10c = 0; local_10c < *(int *)(in_RDI + 0x80); local_10c = local_10c + 1) {
    local_110 = 0;
    local_118 = Mat::operator_cast_to_int_(local_20);
    for (local_11c = 0; local_11c < local_34; local_11c = local_11c + 1) {
      local_128 = Mat::operator_cast_to_signed_char_((Mat *)(in_RDI + 0xd8));
      local_128 = local_128 + (long)(local_44 * local_11c) + (long)(local_44 * local_34 * local_10c)
      ;
      Mat::channel(in_stack_fffffffffffffd88,(int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      pcVar2 = Mat::operator_cast_to_signed_char_(&local_170);
      Mat::~Mat((Mat *)0x164421);
      for (local_174 = 0; local_174 < local_44; local_174 = local_174 + 1) {
        local_110 = (int)pcVar2[local_174] * (int)local_128[local_174] + local_110;
      }
      local_130 = pcVar2;
    }
    local_118[local_10c] = local_110;
  }
  for (local_178 = 0; local_178 < *(int *)(in_RDI + 0x80); local_178 = local_178 + 1) {
    local_180 = Mat::operator_cast_to_int_(local_20);
    local_188 = Mat::operator_cast_to_float_(local_20);
    local_18c = 1.0;
    pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x158),local_178);
    if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
      fVar4 = *(float *)(in_RDI + 0x198);
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x158),local_178);
      local_18c = 1.0 / (fVar4 * *pfVar3);
    }
    else {
      local_18c = 0.0;
    }
    if (*(int *)(in_RDI + 0x84) == 0) {
      local_188[local_178] = (float)local_180[local_178] * local_18c;
    }
    else {
      fVar4 = (float)local_180[local_178] * local_18c;
      pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x118),local_178);
      local_188[local_178] = fVar4 + *pfVar3;
    }
    if (*(int *)(in_RDI + 0x90) == 1) {
      local_190 = 0.0;
      pfVar3 = std::max<float>(local_188 + local_178,&local_190);
      local_188[local_178] = *pfVar3;
    }
  }
  local_4 = 0;
  local_d8 = 1;
LAB_0016473a:
  Mat::~Mat((Mat *)0x164747);
  return local_4;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (use_int8_inference)
    {
        Mat bottom_blob_tm = bottom_blob;
        if (elemsize != 1)
        {
            Mat bottom_blob_int8;
            bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
            if (bottom_blob_int8.empty())
                return -100;

            // quantize, scale and round to nearest
            {
                Option opt_g = opt;
                opt_g.blob_allocator = bottom_blob_int8.allocator;

                quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
            }

            bottom_blob_tm = bottom_blob_int8;
        }

        // num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int sum = 0;
            int* out = top_blob;

            // channels
            for (int q=0; q<channels; q++)
            {
                const signed char* w = (const signed char*)weight_data + size * channels * p + size * q;
                const signed char* m = bottom_blob_tm.channel(q);

                for (int i = 0; i < size; i++)
                {
                    sum += m[i] * w[i];
                }
            }

            out[p] = sum;       
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int* out_s32 = top_blob;
            float* out_f32 = top_blob;
            float top_rescale = 1.f;
            if (weight_data_int8_scales[p] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

            if (bias_term)
                out_f32[p] = out_s32[p] * top_rescale + bias_data[p];
            else
                out_f32[p] = out_s32[p] * top_rescale;

            if (activation_type == 1)
            {
                out_f32[p] = std::max(out_f32[p], 0.f);
            }                
        }

        return 0;
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q=0; q<channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        if (activation_type == 1)
        {
            sum = std::max(sum, 0.f);
        }
        else if (activation_type == 2)
        {
            float slope = activation_params[0];
            sum = sum > 0.f ? sum : sum * slope;
        }
        else if (activation_type == 3)
        {
            float min = activation_params[0];
            float max = activation_params[1];
            if (sum < min)
                sum = min;
            if (sum > max)
                sum = max;
        }
        else if (activation_type == 4)
        {
            sum = 1.f / (1.f + exp(-sum));
        }

        top_blob[p] = sum;
    }

    return 0;
}